

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

shared_ptr<kratos::Var> __thiscall
kratos::Generator::get_auxiliary_var(Generator *this,uint32_t width,bool signed_)

{
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this_00;
  iterator iVar1;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  undefined7 in_register_00000011;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  undefined4 in_register_00000034;
  pair<std::__detail::_Node_iterator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_false,_false>,_bool>
  pVar4;
  shared_ptr<kratos::Var> sVar5;
  long local_38;
  bool local_2c [4];
  key_type local_28 [2];
  uint32_t width_local;
  bool signed__local;
  
  local_28[0] = (key_type)CONCAT71(in_register_00000011,signed_);
  this_00 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)(CONCAT44(in_register_00000034,width) + 0x450);
  iVar1 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(this_00,local_28);
  if (iVar1.
      super__Node_iterator_base<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_false>
      ._M_cur == (__node_type *)0x0) {
    local_2c[0] = true;
    local_2c[1] = false;
    local_2c[2] = false;
    local_2c[3] = false;
    local_38 = CONCAT44(in_register_00000034,width);
    std::make_shared<kratos::Var,kratos::Generator*,char_const(&)[1],unsigned_int&,int,bool&>
              ((Generator **)this,(char (*) [1])&local_38,(uint *)0x216359,(int *)local_28,local_2c)
    ;
    pVar4 = std::
            _Hashtable<unsigned_int,std::pair<unsigned_int_const,std::shared_ptr<kratos::Var>>,std::allocator<std::pair<unsigned_int_const,std::shared_ptr<kratos::Var>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
            ::_M_emplace<unsigned_int&,std::shared_ptr<kratos::Var>&>
                      ((_Hashtable<unsigned_int,std::pair<unsigned_int_const,std::shared_ptr<kratos::Var>>,std::allocator<std::pair<unsigned_int_const,std::shared_ptr<kratos::Var>>>,std::__detail::_Select1st,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                        *)this_00,local_28,this);
    _Var3._M_pi = pVar4._8_8_;
  }
  else {
    p_Var2 = &std::__detail::
              _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              ::at((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<kratos::Var>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    *)this_00,local_28)->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>
    ;
    std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var2);
    _Var3._M_pi = extraout_RDX;
  }
  sVar5.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var3._M_pi;
  sVar5.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<kratos::Var>)sVar5.super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Var> Generator::get_auxiliary_var(uint32_t width, bool signed_) {
    if (auxiliary_vars_.find(width) != auxiliary_vars_.end()) {
        return auxiliary_vars_.at(width);
    }
    auto v = std::make_shared<Var>(this, "", width, 1, signed_);
    auxiliary_vars_.emplace(width, v);
    return v;
}